

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b8a13::CAPIBuildSystemFrontendDelegate::cannotBuildNodeDueToMultipleProducers
          (CAPIBuildSystemFrontendDelegate *this,Node *outputNode,
          vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
          *commands)

{
  _func_void_void_ptr_llb_build_key_t_ptr_ptr_llb_buildsystem_command_t_ptr_ptr_uint64_t *p_Var1;
  void *pvVar2;
  CAPIBuildKey *this_00;
  BuildKey *this_01;
  char *pcVar3;
  Command **ppCVar4;
  size_type sVar5;
  StringRef path;
  BuildKey local_88;
  CAPIBuildKey *local_68;
  llb_build_key_t *output;
  undefined1 local_50 [8];
  string str;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
  *commands_local;
  Node *outputNode_local;
  CAPIBuildSystemFrontendDelegate *this_local;
  
  if ((this->cAPIDelegate).cannot_build_node_due_to_multiple_producers !=
      (_func_void_void_ptr_llb_build_key_t_ptr_ptr_llb_buildsystem_command_t_ptr_ptr_uint64_t *)0x0)
  {
    str.field_2._8_8_ = commands;
    _output = llbuild::buildsystem::Node::getName(outputNode);
    llvm::StringRef::str_abi_cxx11_((string *)local_50,(StringRef *)&output);
    this_00 = (CAPIBuildKey *)operator_new(0x38);
    this_01 = (BuildKey *)std::__cxx11::string::data();
    pcVar3 = (char *)std::__cxx11::string::length();
    path.Length = (size_t)pcVar3;
    path.Data = pcVar3;
    llbuild::buildsystem::BuildKey::makeNode(&local_88,this_01,path);
    CAPIBuildKey::CAPIBuildKey(this_00,&local_88);
    llbuild::buildsystem::BuildKey::~BuildKey(&local_88);
    p_Var1 = (this->cAPIDelegate).cannot_build_node_due_to_multiple_producers;
    pvVar2 = (this->cAPIDelegate).context;
    local_68 = this_00;
    ppCVar4 = std::
              vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
              ::data(commands);
    sVar5 = std::
            vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            ::size(commands);
    (*p_Var1)(pvVar2,(llb_build_key_t **)&local_68,(llb_buildsystem_command_t **)ppCVar4,sVar5);
    llb_build_key_destroy((llb_build_key_t *)local_68);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

virtual void cannotBuildNodeDueToMultipleProducers(Node* outputNode,
               std::vector<Command*> commands) override {
    if (cAPIDelegate.cannot_build_node_due_to_multiple_producers) {
      auto str = outputNode->getName().str();
      auto output = (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeNode(str));

      cAPIDelegate.cannot_build_node_due_to_multiple_producers(
        cAPIDelegate.context,
        &output,
        (llb_buildsystem_command_t**)commands.data(),
        commands.size()
      );
      
      llb_build_key_destroy(output);
    }
  }